

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnRefFunc(SharedValidator *this,Location *loc,Var *func_var)

{
  Result RVar1;
  Result RVar2;
  Enum EVar3;
  Index func_type;
  Index local_74;
  Var local_70;
  
  RVar1 = CheckInstr(this,(Opcode)0xd8,loc);
  Var::Var(&local_70,func_var);
  RVar2 = CheckFuncIndex(this,&local_70,(FuncType *)0x0);
  Var::~Var(&local_70);
  EVar3 = Error;
  if ((RVar1.enum_ != Error) && (RVar2.enum_ != Error)) {
    if (this->in_init_expr_ == true) {
      if (func_var->type_ != Index) goto LAB_0016ebf9;
      local_74 = (func_var->field_2).index_;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_insert_unique<unsigned_int>(&(this->declared_funcs_)._M_t,&local_74);
    }
    else {
      std::vector<wabt::Var,_std::allocator<wabt::Var>_>::push_back
                (&this->check_declared_funcs_,func_var);
    }
    if (func_var->type_ != Index) {
LAB_0016ebf9:
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                    ,0x3a,"Index wabt::Var::index() const");
    }
    func_type = GetFunctionTypeIndex(this,(func_var->field_2).index_);
    RVar1 = TypeChecker::OnRefFuncExpr(&this->typechecker_,func_type);
    EVar3 = (Enum)(RVar1.enum_ == Error);
  }
  return (Result)EVar3;
}

Assistant:

Result SharedValidator::OnRefFunc(const Location& loc, Var func_var) {
  Result result = CheckInstr(Opcode::RefFunc, loc);
  result |= CheckFuncIndex(func_var);
  if (Succeeded(result)) {
    // References in initializer expressions are considered declarations, as
    // opposed to references in function bodies that are considered usages.
    if (in_init_expr_) {
      declared_funcs_.insert(func_var.index());
    } else {
      check_declared_funcs_.push_back(func_var);
    }
    Index func_type = GetFunctionTypeIndex(func_var.index());
    result |= typechecker_.OnRefFuncExpr(func_type);
  }
  return result;
}